

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int iso9660_finish_entry(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  mode_t mVar6;
  int iVar7;
  ssize_t sVar8;
  ulong uVar9;
  int iVar10;
  ulong s;
  undefined8 local_48;
  undefined4 local_40;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined2 local_3a;
  
  pvVar1 = a->format_data;
  iVar10 = 0;
  if (((*(long *)((long)pvVar1 + 0x10) != 0) &&
      (mVar6 = archive_entry_filetype(*(archive_entry **)(*(long *)((long)pvVar1 + 0x10) + 0x20)),
      mVar6 == 0x8000)) && (iVar10 = 0, *(long *)(*(long *)((long)pvVar1 + 0x10) + 0x98) != 0)) {
    uVar9 = *(ulong *)((long)pvVar1 + 0x38);
    iVar10 = -0x1e;
    while (uVar9 != 0) {
      s = a->null_length;
      if (uVar9 < a->null_length) {
        s = uVar9;
      }
      sVar8 = write_iso9660_data(a,a->nulls,s);
      if (sVar8 < 0) {
        return -0x1e;
      }
      uVar9 = *(long *)((long)pvVar1 + 0x38) - s;
      *(ulong *)((long)pvVar1 + 0x38) = uVar9;
    }
    if ((*(byte *)((long)pvVar1 + 0x1d8) & 2) != 0) {
      pvVar3 = a->format_data;
      lVar2 = *(long *)((long)pvVar3 + 0x10);
      archive_entry_set_size
                (*(archive_entry **)(lVar2 + 0x20),*(la_int64_t *)((long)pvVar3 + 0x238));
      lVar4 = *(long *)((long)a->format_data + 0x102f0);
      lVar5 = *(long *)((long)a->format_data + 0x102e0);
      local_48 = 0x7d6dbc99653e437;
      local_40 = *(undefined4 *)(lVar2 + 0xc4);
      local_3c = *(undefined1 *)(lVar2 + 0xc0);
      local_3b = *(undefined1 *)(lVar2 + 0xc1);
      local_3a = 0;
      wb_set_offset(a,*(int64_t *)(lVar2 + 0x90));
      iVar7 = wb_write_to_temp(a,&local_48,0x10);
      if (iVar7 != 0) {
        return -0x1e;
      }
      iVar7 = wb_write_to_temp(a,*(void **)((long)pvVar3 + 0x220),
                               (long)*(int *)((long)pvVar3 + 0x230) << 2);
      if (iVar7 != 0) {
        return -0x1e;
      }
      wb_set_offset(a,(lVar4 - lVar5) + 0x10000);
    }
    iVar7 = wb_write_padding_to_temp
                      (a,*(int64_t *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8));
    if (iVar7 == 0) {
      lVar2 = *(long *)((long)pvVar1 + 0x10);
      *(int *)(*(long *)(lVar2 + 0xb0) + 0x10) =
           (int)(*(long *)(*(long *)(lVar2 + 0xb0) + 8) + 0x7ffU >> 0xb);
      *(undefined8 *)(lVar2 + 8) = 0;
      **(long **)((long)pvVar1 + 0xa0) = lVar2;
      *(long *)((long)pvVar1 + 0xa0) = lVar2 + 8;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

static int
iso9660_finish_entry(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;

	if (iso9660->cur_file == NULL)
		return (ARCHIVE_OK);
	if (archive_entry_filetype(iso9660->cur_file->entry) != AE_IFREG)
		return (ARCHIVE_OK);
	if (iso9660->cur_file->content.size == 0)
		return (ARCHIVE_OK);

	/* If there are unwritten data, write null data instead. */
	while (iso9660->bytes_remaining > 0) {
		size_t s;

		s = (iso9660->bytes_remaining > a->null_length)?
		    a->null_length: (size_t)iso9660->bytes_remaining;
		if (write_iso9660_data(a, a->nulls, s) < 0)
			return (ARCHIVE_FATAL);
		iso9660->bytes_remaining -= s;
	}

	if (iso9660->zisofs.making && zisofs_finish_entry(a) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Write padding. */
	if (wb_write_padding_to_temp(a, iso9660->cur_file->cur_content->size)
	    != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	/* Compute the logical block number. */
	iso9660->cur_file->cur_content->blocks = (int)
	    ((iso9660->cur_file->cur_content->size
	     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

	/* Add the current file to data file list. */
	isofile_add_data_file(iso9660, iso9660->cur_file);

	return (ARCHIVE_OK);
}